

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLinear.c
# Opt level: O3

Move * ddUndoMoves(DdManager *table,Move *moves)

{
  int iVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdHalfWord y;
  DdHalfWord x;
  DdNode *pDVar4;
  
  if (moves == (Move *)0x0) {
    pDVar2 = (DdNode *)0x0;
  }
  else {
    pDVar3 = (DdNode *)0x0;
    do {
      pDVar2 = cuddDynamicAllocNode(table);
      if (pDVar2 == (DdNode *)0x0) {
        pDVar2 = pDVar3;
        if (pDVar3 != (DdNode *)0x0) {
LAB_009215c9:
          pDVar3 = table->nextFree;
          do {
            pDVar4 = pDVar2;
            pDVar2 = (pDVar4->type).kids.T;
            pDVar4->ref = 0;
            pDVar4->next = pDVar3;
            pDVar3 = pDVar4;
          } while (pDVar2 != (DdNode *)0x0);
          table->nextFree = pDVar4;
        }
        return (Move *)0xffffffffffffffff;
      }
      x = moves->x;
      pDVar2->index = x;
      y = moves->y;
      pDVar2->ref = y;
      (pDVar2->type).kids.T = pDVar3;
      if (moves->flags == 1) {
        *(undefined4 *)&pDVar2->next = 2;
        iVar1 = cuddLinearInPlace(table,x,y);
        if (iVar1 != 0) {
          x = moves->x;
          y = moves->y;
          goto LAB_00921576;
        }
        goto LAB_009215c9;
      }
      if (moves->flags == 0) {
        *(undefined4 *)&pDVar2->next = 0;
LAB_00921576:
        iVar1 = cuddSwapInPlace(table,x,y);
      }
      else {
        *(undefined4 *)&pDVar2->next = 1;
        iVar1 = cuddSwapInPlace(table,x,y);
        if (iVar1 == 0) goto LAB_009215c9;
        iVar1 = cuddLinearInPlace(table,moves->x,moves->y);
      }
      if (iVar1 == 0) goto LAB_009215c9;
      *(int *)((long)&pDVar2->next + 4) = iVar1;
      moves = moves->next;
      pDVar3 = pDVar2;
    } while (moves != (Move *)0x0);
  }
  return (Move *)pDVar2;
}

Assistant:

static Move*
ddUndoMoves(
  DdManager * table,
  Move * moves)
{
    Move *invmoves = NULL;
    Move *move;
    Move *invmove;
    int size;

    for (move = moves; move != NULL; move = move->next) {
        invmove = (Move *) cuddDynamicAllocNode(table);
        if (invmove == NULL) goto ddUndoMovesOutOfMem;
        invmove->x = move->x;
        invmove->y = move->y;
        invmove->next = invmoves;
        invmoves = invmove;
        if (move->flags == CUDD_SWAP_MOVE) {
            invmove->flags = CUDD_SWAP_MOVE;
            size = cuddSwapInPlace(table,(int)move->x,(int)move->y);
            if (!size) goto ddUndoMovesOutOfMem;
        } else if (move->flags == CUDD_LINEAR_TRANSFORM_MOVE) {
            invmove->flags = CUDD_INVERSE_TRANSFORM_MOVE;
            size = cuddLinearInPlace(table,(int)move->x,(int)move->y);
            if (!size) goto ddUndoMovesOutOfMem;
            size = cuddSwapInPlace(table,(int)move->x,(int)move->y);
            if (!size) goto ddUndoMovesOutOfMem;
        } else { /* must be CUDD_INVERSE_TRANSFORM_MOVE */
#ifdef DD_DEBUG
            (void) fprintf(table->err,"Unforseen event in ddUndoMoves!\n");
#endif
            invmove->flags = CUDD_LINEAR_TRANSFORM_MOVE;
            size = cuddSwapInPlace(table,(int)move->x,(int)move->y);
            if (!size) goto ddUndoMovesOutOfMem;
            size = cuddLinearInPlace(table,(int)move->x,(int)move->y);
            if (!size) goto ddUndoMovesOutOfMem;
        }
        invmove->size = size;
    }

    return(invmoves);

ddUndoMovesOutOfMem:
    while (invmoves != NULL) {
        move = invmoves->next;
        cuddDeallocMove(table, invmoves);
        invmoves = move;
    }
    return((Move *) CUDD_OUT_OF_MEM);

}